

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShellIntrinsics.cpp
# Opt level: O0

IntrinsicResult intrinsic_child(Context *context,IntrinsicResult *partialResult)

{
  bool bVar1;
  String local_f8;
  String local_e8;
  Value local_d8;
  undefined4 local_c4;
  String local_c0;
  Value local_b0;
  undefined1 local_a0 [8];
  String pathSep;
  undefined1 local_80 [24];
  String filename;
  String local_50;
  undefined1 local_40 [24];
  String path;
  IntrinsicResult *partialResult_local;
  Context *context_local;
  
  MiniScript::String::String(&local_50,"parentPath");
  MiniScript::Context::GetVar((Context *)local_40,(String *)partialResult,(LocalOnlyMode)&local_50);
  MiniScript::Value::ToString((Value *)(local_40 + 0x10),(Machine *)local_40);
  MiniScript::Value::~Value((Value *)local_40);
  MiniScript::String::~String(&local_50);
  MiniScript::String::String((String *)&pathSep.isTemp,"childName");
  MiniScript::Context::GetVar((Context *)local_80,(String *)partialResult,(char)&pathSep + 8);
  MiniScript::Value::ToString((Value *)(local_80 + 0x10),(Machine *)local_80);
  MiniScript::Value::~Value((Value *)local_80);
  MiniScript::String::~String((String *)&pathSep.isTemp);
  MiniScript::String::String((String *)local_a0,"/");
  bVar1 = MiniScript::String::EndsWith((String *)(local_40 + 0x10),(String *)local_a0);
  if (bVar1) {
    MiniScript::String::operator+(&local_c0,(String *)(local_40 + 0x10));
    MiniScript::Value::Value(&local_b0,&local_c0);
    MiniScript::IntrinsicResult::IntrinsicResult((IntrinsicResult *)context,&local_b0,true);
    MiniScript::Value::~Value(&local_b0);
    MiniScript::String::~String(&local_c0);
  }
  else {
    MiniScript::String::operator+(&local_f8,(String *)(local_40 + 0x10));
    MiniScript::String::operator+(&local_e8,&local_f8);
    MiniScript::Value::Value(&local_d8,&local_e8);
    MiniScript::IntrinsicResult::IntrinsicResult((IntrinsicResult *)context,&local_d8,true);
    MiniScript::Value::~Value(&local_d8);
    MiniScript::String::~String(&local_e8);
    MiniScript::String::~String(&local_f8);
  }
  local_c4 = 1;
  MiniScript::String::~String((String *)local_a0);
  MiniScript::String::~String((String *)(local_80 + 0x10));
  MiniScript::String::~String((String *)(local_40 + 0x10));
  return (IntrinsicResult)(IntrinsicResultStorage *)context;
}

Assistant:

static IntrinsicResult intrinsic_child(Context *context, IntrinsicResult partialResult) {
	String path = context->GetVar("parentPath").ToString();
	String filename = context->GetVar("childName").ToString();
	#if _WIN32 || _WIN64
		String pathSep = "\\";
	#else
		String pathSep = "/";
	#endif
	if (path.EndsWith(pathSep)) return IntrinsicResult(path + filename);
	return IntrinsicResult(path + pathSep + filename);
}